

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkmsdevice.cpp
# Opt level: O2

QPlatformScreen * __thiscall
QKmsDevice::createScreenForConnector
          (QKmsDevice *this,drmModeResPtr resources,drmModeConnectorPtr connector,ScreenInfo *vinfo)

{
  QList<QKmsPlane> *this_00;
  ushort uVar1;
  ushort uVar2;
  long lVar3;
  drmModeModeInfoPtr p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  QSize QVar9;
  _drmModeModeInfo *p_Var10;
  uint uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  qsizetype qVar18;
  bool bVar19;
  bool bVar20;
  char cVar21;
  bool bVar22;
  uint uVar23;
  int iVar24;
  uint uVar25;
  int iVar26;
  uint32_t uVar27;
  long lVar28;
  QDebug *pQVar29;
  long lVar30;
  pointer p_Var31;
  QSize *pQVar32;
  iterator iVar33;
  iterator iVar34;
  int *piVar35;
  QKmsPlane *pQVar36;
  QPlatformScreen *pQVar37;
  QString *pQVar38;
  QString *crtcPlanePair;
  uint uVar39;
  uint uVar40;
  ulong uVar41;
  char *pcVar42;
  undefined4 *puVar43;
  anon_union_24_3_e3d07ef4_for_data *paVar44;
  char16_t *pcVar45;
  int i;
  uint uVar46;
  ulong uVar47;
  QKmsPlane *plane;
  _drmModeModeInfo *__s2;
  ulong uVar48;
  long in_FS_OFFSET;
  byte bVar49;
  undefined1 auVar50 [16];
  anon_union_24_3_e3d07ef4_for_data *in_stack_fffffffffffffc28;
  uint local_3c0;
  QList<QKmsPlane> *__range5;
  bool ok;
  QSize local_368;
  undefined1 local_360 [8];
  QSize local_358;
  undefined1 local_350 [16];
  QString *pQStack_340;
  long local_338;
  QArrayDataPointer<char16_t> local_328;
  QArrayDataPointer<char16_t> local_308;
  double local_2e8;
  double dStack_2e0;
  QArrayDataPointer<char16_t> local_2d8;
  QArrayDataPointer<_drmModeModeInfo> local_2b8;
  QArrayDataPointer<char> local_298;
  QVariantMap userConnectorConfig;
  undefined1 local_270 [12];
  int configurationRefresh;
  undefined8 local_260;
  QArrayDataPointer<char> local_258;
  anon_union_24_3_e3d07ef4_for_data local_238;
  undefined8 local_220;
  undefined1 local_218 [32];
  anon_union_24_3_e3d07ef4_for_data local_1f8;
  char *local_1e0;
  anon_union_24_3_e3d07ef4_for_data local_1d8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined4 local_198;
  undefined1 local_188 [24];
  undefined8 uStack_170;
  uint32_t local_168;
  qreal local_160;
  qreal qStack_158;
  undefined8 local_150;
  bool local_148;
  drmModeCrtcPtr local_140;
  QArrayDataPointer<_drmModeModeInfo> QStack_138;
  drmModeSubPixel local_120;
  drmModePropertyPtr local_118;
  drmModePropertyBlobPtr p_Stack_110;
  bool local_108;
  uint32_t local_104;
  bool local_100;
  uint32_t local_fc;
  bool local_f8;
  QString local_f0;
  QList<QKmsPlane> QStack_d8;
  QKmsPlane *local_c0;
  QSize local_b8;
  QKmsPlane *local_b0;
  QSize QStack_a8;
  drmModeModeInfo configurationModeline;
  undefined4 extraout_var;
  
  bVar49 = 0;
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  local_258.size = -0x5555555555555556;
  local_258.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_258.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)&local_258,"UNKNOWN",-1);
  if ((ulong)connector->connector_type < 0x11) {
    QByteArray::operator=
              ((QByteArray *)&local_258,
               _ZL20connector_type_names_rel +
               *(int *)(_ZL20connector_type_names_rel + (ulong)connector->connector_type * 4));
  }
  QByteArray::number((uint)(QArrayDataPointer<char> *)local_188,connector->connector_type_id);
  QByteArray::append((QByteArray *)&local_258);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_188);
  uVar23 = crtcForConnector(this,resources,connector);
  if ((int)uVar23 < 0) {
    local_188._0_4_ = 2;
    local_188._20_4_ = 0;
    local_188._4_4_ = 0;
    local_188._8_4_ = 0;
    local_188._12_4_ = 0;
    local_188._16_4_ = 0;
    uStack_170 = "default";
    QMessageLogger::warning();
    pQVar29 = QDebug::operator<<((QDebug *)&configurationModeline,
                                 "No usable crtc/encoder pair for connector");
    QDebug::operator<<(pQVar29,(QByteArray *)&local_258);
    QDebug::~QDebug((QDebug *)&configurationModeline);
    pQVar37 = (QPlatformScreen *)0x0;
    goto LAB_00116fde;
  }
  local_260 = -1;
  configurationRefresh = 0;
  configurationModeline.name[0xc] = -0x56;
  configurationModeline.name[0xd] = -0x56;
  configurationModeline.name[0xe] = -0x56;
  configurationModeline.name[0xf] = -0x56;
  configurationModeline.name[0x10] = -0x56;
  configurationModeline.name[0x11] = -0x56;
  configurationModeline.name[0x12] = -0x56;
  configurationModeline.name[0x13] = -0x56;
  configurationModeline.name[0x14] = -0x56;
  configurationModeline.name[0x15] = -0x56;
  configurationModeline.name[0x16] = -0x56;
  configurationModeline.name[0x17] = -0x56;
  configurationModeline.name[0x18] = -0x56;
  configurationModeline.name[0x19] = -0x56;
  configurationModeline.name[0x1a] = -0x56;
  configurationModeline.name[0x1b] = -0x56;
  configurationModeline.type = 0xaaaaaaaa;
  configurationModeline.name[0] = -0x56;
  configurationModeline.name[1] = -0x56;
  configurationModeline.name[2] = -0x56;
  configurationModeline.name[3] = -0x56;
  configurationModeline.name[4] = -0x56;
  configurationModeline.name[5] = -0x56;
  configurationModeline.name[6] = -0x56;
  configurationModeline.name[7] = -0x56;
  configurationModeline.name[8] = -0x56;
  configurationModeline.name[9] = -0x56;
  configurationModeline.name[10] = -0x56;
  configurationModeline.name[0xb] = -0x56;
  configurationModeline.vsync_start = 0xaaaa;
  configurationModeline.vsync_end = 0xaaaa;
  configurationModeline.vtotal = 0xaaaa;
  configurationModeline.vscan = 0xaaaa;
  configurationModeline.vrefresh = 0xaaaaaaaa;
  configurationModeline.flags = 0xaaaaaaaa;
  configurationModeline.clock = 0xaaaaaaaa;
  configurationModeline.hdisplay = 0xaaaa;
  configurationModeline.hsync_start = 0xaaaa;
  configurationModeline.hsync_end = 0xaaaa;
  configurationModeline.htotal = 0xaaaa;
  configurationModeline.hskew = 0xaaaa;
  configurationModeline.vdisplay = 0xaaaa;
  configurationModeline.name[0x1c] = -0x56;
  configurationModeline.name[0x1d] = -0x56;
  configurationModeline.name[0x1e] = -0x56;
  configurationModeline.name[0x1f] = -0x56;
  local_270._0_8_ = (this->m_screenConfig->m_outputSettings).d.d.ptr;
  if ((QMapData<std::map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>_>
       *)local_270._0_8_ !=
      (QMapData<std::map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>_>
       *)0x0) {
    LOCK();
    (((QMapData<std::map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>_>
       *)local_270._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((QMapData<std::map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>_>
                        *)local_270._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  userConnectorConfig.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
        )(totally_ordered_wrapper<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_*>
          )0xaaaaaaaaaaaaaaaa;
  QString::fromUtf8<void>((QString *)local_188,(QByteArray *)&local_258);
  local_1d8.shared = (PrivateShared *)0x0;
  QMap<QString,_QMap<QString,_QVariant>_>::value
            ((QMap<QString,_QMap<QString,_QVariant>_> *)&userConnectorConfig,(QString *)local_270,
             (QMap<QString,_QVariant> *)local_188);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2
            ((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
              *)&local_1d8.shared);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_188);
  local_298.size = -0x5555555555555556;
  local_298.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_298.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  local_218._0_8_ = (PrivateShared *)0x0;
  local_238.shared = (PrivateShared *)0x0;
  local_238._8_8_ = 0;
  local_218._8_8_ = L"mode";
  local_238._16_8_ = 0;
  local_218._16_8_ = 4;
  local_2b8.d = (Data *)0x0;
  local_2d8.d = (Data *)0x0;
  local_2d8.ptr = (char16_t *)0x0;
  local_2b8.ptr = (_drmModeModeInfo *)0x12270c;
  local_2d8.size = 0;
  local_2b8.size = 9;
  QVariant::QVariant((QVariant *)&local_1d8,(QString *)&local_2b8);
  QMap<QString,_QVariant>::value
            ((QVariant *)local_188,(QMap<QString,_QVariant> *)&userConnectorConfig,
             (QString *)local_218,(QVariant *)&local_1d8);
  QVariant::toByteArray();
  QByteArray::toLower_helper((QByteArray *)&local_298);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_1f8);
  QVariant::~QVariant((QVariant *)local_188);
  QVariant::~QVariant((QVariant *)&local_1d8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_2b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2d8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_218);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_238);
  local_188._0_4_ = 0x121af4;
  local_188._4_4_ = 0;
  bVar19 = operator==((QByteArray *)&local_298,(char **)local_188);
  if (bVar19) {
    bVar22 = false;
LAB_00114fb7:
    bVar5 = false;
LAB_00114fb9:
    bVar7 = false;
LAB_00114fbb:
    bVar8 = false;
LAB_00114fbd:
    bVar6 = false;
  }
  else {
    local_188._0_4_ = 0x121af8;
    local_188._4_4_ = 0;
    bVar22 = operator==((QByteArray *)&local_298,(char **)local_188);
    if (bVar22) {
      bVar22 = true;
      goto LAB_00114fb7;
    }
    local_188._0_4_ = 0x121b02;
    local_188._4_4_ = 0;
    bVar22 = operator==((QByteArray *)&local_298,(char **)local_188);
    if (bVar22) {
      bVar8 = true;
      bVar22 = false;
      bVar5 = false;
      bVar7 = false;
      goto LAB_00114fbd;
    }
    local_188._0_4_ = 0x121b0a;
    local_188._4_4_ = 0;
    bVar22 = operator==((QByteArray *)&local_298,(char **)local_188);
    if (bVar22) {
      bVar5 = true;
      bVar22 = false;
      goto LAB_00114fb9;
    }
    pcVar42 = local_298.ptr;
    if (local_298.ptr == (char *)0x0) {
      pcVar42 = (char *)&QByteArray::_empty;
    }
    bVar22 = false;
    iVar24 = __isoc99_sscanf(pcVar42,"%dx%d@%d",&local_260,(long)&local_260 + 4,
                             &configurationRefresh);
    bVar6 = true;
    if (iVar24 != 3) {
      pcVar42 = local_298.ptr;
      if (local_298.ptr == (char *)0x0) {
        pcVar42 = (char *)&QByteArray::_empty;
      }
      bVar22 = false;
      iVar24 = __isoc99_sscanf(pcVar42,"%dx%d",&local_260,(long)&local_260 + 4);
      bVar5 = false;
      bVar7 = false;
      bVar8 = false;
      if (iVar24 == 2) goto LAB_00114fc5;
      local_1f8._0_4_ = -NAN;
      configurationModeline.type = 0x20;
      configurationModeline.hskew = 0;
      configurationModeline._16_8_ = configurationModeline._16_8_ & 0xffffffffffff;
      configurationModeline.vrefresh = 0;
      configurationModeline.flags = 0;
      local_188._0_4_ = 0xaaaaaaaa;
      local_188._4_4_ = 0xaaaaaaaa;
      local_188._8_4_ = 0xaaaaaaaa;
      local_188._12_4_ = 0xaaaaaaaa;
      local_1d8.shared = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
      local_1d8._8_8_ = 0xaaaaaaaaaaaaaaaa;
      pcVar42 = local_298.ptr;
      if (local_298.ptr == (char *)0x0) {
        pcVar42 = (char *)&QByteArray::_empty;
      }
      in_stack_fffffffffffffc28 = &local_1d8;
      iVar24 = __isoc99_sscanf(pcVar42,"%f %hd %hd %hd %hd %hd %hd %hd %hd %15s %15s",&local_1f8,
                               &configurationModeline.hdisplay,&configurationModeline.hsync_start,
                               &configurationModeline.hsync_end,&configurationModeline.htotal,
                               &configurationModeline.vdisplay,&configurationModeline.vsync_start,
                               &configurationModeline.vsync_end,&configurationModeline.vtotal,
                               local_188,in_stack_fffffffffffffc28);
      if (iVar24 != 0xb) {
LAB_00117052:
        local_188._0_4_ = 2;
        local_188._20_4_ = 0;
        local_188._4_4_ = 0;
        local_188._8_4_ = 0;
        local_188._12_4_ = 0;
        local_188._16_4_ = 0;
        uStack_170 = "default";
        pcVar42 = local_298.ptr;
        if (local_298.ptr == (char *)0x0) {
          pcVar42 = (char *)&QByteArray::_empty;
        }
        bVar5 = false;
        QMessageLogger::warning(local_188,"Invalid mode \"%s\" for output %s",pcVar42);
        bVar22 = true;
        goto LAB_00114fb9;
      }
      configurationModeline.clock = (uint32_t)(long)((float)local_1f8._0_4_ * 1000.0);
      iVar24 = bcmp(local_188,"+hsync",7);
      if (iVar24 == 0) {
        uVar25 = 1;
      }
      else {
        iVar24 = bcmp(local_188,"-hsync",7);
        if (iVar24 != 0) goto LAB_00117052;
        uVar25 = 2;
      }
      uVar25 = uVar25 | configurationModeline.flags;
      configurationModeline.flags = uVar25;
      iVar24 = bcmp(&local_1d8,"+vsync",7);
      if (iVar24 == 0) {
        uVar40 = 4;
      }
      else {
        iVar24 = bcmp(&local_1d8,"-vsync",7);
        if (iVar24 != 0) goto LAB_00117052;
        uVar40 = 8;
      }
      configurationModeline.flags = uVar40 | uVar25;
      bVar7 = true;
      bVar22 = false;
      bVar5 = false;
      goto LAB_00114fbb;
    }
    bVar5 = false;
    bVar7 = false;
    bVar8 = false;
    bVar6 = true;
  }
LAB_00114fc5:
  memset((ScreenInfo *)local_188,0,0xf8);
  ScreenInfo::ScreenInfo((ScreenInfo *)local_188);
  ScreenInfo::operator=(vinfo,(ScreenInfo *)local_188);
  QKmsOutput::~QKmsOutput((QKmsOutput *)(local_188 + 0x10));
  local_1f8._0_4_ = 0;
  local_1f8._4_4_ = 0;
  local_218._0_8_ = (PrivateShared *)0x0;
  local_218._8_8_ = (char16_t *)0x0;
  local_1f8._8_4_ = 0x122720;
  local_1f8._12_4_ = 0;
  local_218._16_8_ = 0;
  local_1f8._16_4_ = 0xc;
  local_1f8._20_4_ = 0;
  QVariant::QVariant((QVariant *)&local_1d8,0x7fffffff);
  QMap<QString,_QVariant>::value
            ((QVariant *)local_188,&userConnectorConfig,(QString *)&local_1f8,(QVariant *)&local_1d8
            );
  iVar24 = QVariant::toInt((bool *)local_188);
  vinfo->virtualIndex = iVar24;
  QVariant::~QVariant((QVariant *)local_188);
  QVariant::~QVariant((QVariant *)&local_1d8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1f8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_218);
  local_188._0_4_ = 0;
  local_188._4_4_ = 0;
  local_1d8.shared = (PrivateShared *)0x0;
  local_1d8._8_8_ = 0;
  local_188._8_4_ = 0x12273a;
  local_188._12_4_ = 0;
  local_1d8._16_8_ = 0;
  local_188._16_4_ = 10;
  local_188._20_4_ = 0;
  bVar20 = QMap<QString,_QVariant>::contains(&userConnectorConfig,(QString *)local_188);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_188);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1d8);
  if (bVar20) {
    local_1f8._16_4_ = 0xaaaaaaaa;
    local_1f8._20_4_ = 0xaaaaaaaa;
    local_1f8._0_4_ = 0xaaaaaaaa;
    local_1f8._4_4_ = 0xaaaaaaaa;
    local_1f8._8_4_ = 0xaaaaaaaa;
    local_1f8._12_4_ = 0xaaaaaaaa;
    local_218._0_8_ = (PrivateShared *)0x0;
    local_238.shared = (PrivateShared *)0x0;
    local_238._8_8_ = 0;
    local_238._16_8_ = 0;
    local_218._8_8_ = L"virtualPos";
    local_218._16_8_ = 10;
    local_1d8.shared = (PrivateShared *)0x0;
    local_1d8._8_8_ = 0;
    local_1d8._16_8_ = 0;
    uStack_1c0 = 2;
    QMap<QString,_QVariant>::value
              ((QVariant *)local_188,&userConnectorConfig,(QString *)local_218,
               (QVariant *)&local_1d8);
    QVariant::toByteArray();
    QVariant::~QVariant((QVariant *)local_188);
    QVariant::~QVariant((QVariant *)&local_1d8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_218);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_238);
    local_188._16_4_ = 0xaaaaaaaa;
    local_188._20_4_ = 0xaaaaaaaa;
    local_188._0_4_ = 0xaaaaaaaa;
    local_188._4_4_ = 0xaaaaaaaa;
    local_188._8_4_ = 0xaaaaaaaa;
    local_188._12_4_ = 0xaaaaaaaa;
    QByteArray::split((char)local_188);
    if (CONCAT44(local_188._20_4_,local_188._16_4_) == 2) {
      QByteArray::trimmed_helper((QByteArray *)&local_1d8);
      uVar25 = QByteArray::toInt((bool *)local_1d8.data,0);
      QByteArray::trimmed_helper((QByteArray *)local_218);
      lVar28 = QByteArray::toInt((bool *)local_218,0);
      vinfo->virtualPos = (QPoint)((ulong)uVar25 | lVar28 << 0x20);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_218);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_1d8);
    }
    QArrayDataPointer<QByteArray>::~QArrayDataPointer((QArrayDataPointer<QByteArray> *)local_188);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_1f8);
  }
  local_218._0_8_ = (PrivateShared *)0x0;
  local_218._8_8_ = (char16_t *)0x0;
  local_1f8._0_4_ = 0.0;
  local_1f8._4_4_ = 0;
  local_218._16_8_ = 0;
  local_1f8._8_4_ = 0x122750;
  local_1f8._12_4_ = 0;
  local_1f8._16_4_ = 7;
  local_1f8._20_4_ = 0;
  local_1d8.shared = (PrivateShared *)0x0;
  local_1d8._8_8_ = 0;
  local_1d8._16_8_ = 0;
  uStack_1c0 = 2;
  QMap<QString,_QVariant>::value
            ((QVariant *)local_188,&userConnectorConfig,(QString *)&local_1f8,(QVariant *)&local_1d8
            );
  cVar21 = QVariant::toBool();
  QVariant::~QVariant((QVariant *)local_188);
  QVariant::~QVariant((QVariant *)&local_1d8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1f8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_218);
  if (cVar21 != '\0') {
    vinfo->isPrimary = true;
  }
  uVar25 = resources->crtcs[uVar23];
  if (bVar19) {
    qLcKmsDebug();
    if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_188._0_4_ = 2;
      local_188._4_4_ = 0;
      local_188._8_4_ = 0;
      local_188._12_4_ = 0;
      local_188._16_4_ = 0;
      local_188._20_4_ = 0;
      uStack_170 = qLcKmsDebug::category.name;
      QMessageLogger::debug();
      pQVar29 = QDebug::operator<<((QDebug *)&local_1d8.shared,"Turning off output");
      QDebug::operator<<(pQVar29,(QByteArray *)&local_258);
      QDebug::~QDebug((QDebug *)&local_1d8.shared);
    }
    pQVar37 = (QPlatformScreen *)0x0;
    drmModeSetCrtc(this->m_dri_fd,uVar25,0,0,0,0,
                   (ulong)in_stack_fffffffffffffc28 & 0xffffffff00000000,0);
  }
  else {
    if ((bVar22) && (connector->connection == DRM_MODE_DISCONNECTED)) {
      qLcKmsDebug();
      if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
        local_188._0_4_ = 2;
        local_188._4_4_ = 0;
        local_188._8_4_ = 0;
        local_188._12_4_ = 0;
        local_188._16_4_ = 0;
        local_188._20_4_ = 0;
        uStack_170 = qLcKmsDebug::category.name;
        QMessageLogger::debug();
        pcVar42 = "Skipping disconnected output";
LAB_0011547f:
        pQVar29 = QDebug::operator<<((QDebug *)&local_1d8.shared,pcVar42);
        QDebug::operator<<(pQVar29,(QByteArray *)&local_258);
        QDebug::~QDebug((QDebug *)&local_1d8.shared);
      }
    }
    else {
      if (!bVar5) {
        local_1a8 = 0;
        uStack_1a0 = 0;
        local_1b8 = 0;
        uStack_1b0 = 0;
        local_198 = 0;
        local_1d8._16_8_ = 0;
        uStack_1c0 = 0;
        local_1d8.shared = (PrivateShared *)0x0;
        local_1d8._8_8_ = 0;
        lVar28 = drmModeGetEncoder(this->m_dri_fd,connector->encoder_id);
        if (lVar28 != 0) {
          lVar30 = drmModeGetCrtc(this->m_dri_fd,*(undefined4 *)(lVar28 + 8));
          drmModeFreeEncoder(lVar28);
          if (lVar30 == 0) goto LAB_0011573b;
          if (*(int *)(lVar30 + 0x18) != 0) {
            puVar43 = (undefined4 *)(lVar30 + 0x1c);
            paVar44 = &local_1d8;
            for (lVar28 = 0x11; lVar28 != 0; lVar28 = lVar28 + -1) {
              *(undefined4 *)paVar44 = *puVar43;
              puVar43 = puVar43 + (ulong)bVar49 * -2 + 1;
              paVar44 = (anon_union_24_3_e3d07ef4_for_data *)
                        ((long)paVar44 + (ulong)bVar49 * -8 + 4);
            }
          }
          drmModeFreeCrtc(lVar30);
        }
        local_2b8.d = (Data *)0x0;
        local_2b8.ptr = (_drmModeModeInfo *)0x0;
        local_2b8.size = 0;
        QList<_drmModeModeInfo>::reserve
                  ((QList<_drmModeModeInfo> *)&local_2b8,(long)connector->count_modes);
        qLcKmsDebug();
        if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0)
        {
          local_188._0_4_ = 2;
          local_188._4_4_ = 0;
          local_188._8_4_ = 0;
          local_188._12_4_ = 0;
          local_188._16_4_ = 0;
          local_188._20_4_ = 0;
          uStack_170 = qLcKmsDebug::category.name;
          QMessageLogger::debug();
          pQVar29 = QDebug::operator<<((QDebug *)&local_1f8.shared,(QByteArray *)&local_258);
          pQVar29 = QDebug::operator<<(pQVar29,"mode count:");
          pQVar29 = QDebug::operator<<(pQVar29,connector->count_modes);
          pQVar29 = QDebug::operator<<(pQVar29,"crtc index:");
          pQVar29 = QDebug::operator<<(pQVar29,uVar23);
          pQVar29 = QDebug::operator<<(pQVar29,"crtc id:");
          QDebug::operator<<(pQVar29,uVar25);
          QDebug::~QDebug((QDebug *)&local_1f8.shared);
        }
        lVar28 = 0;
        for (lVar30 = 0; iVar24 = configurationRefresh, p_Var10 = local_2b8.ptr,
            lVar30 < connector->count_modes; lVar30 = lVar30 + 1) {
          p_Var4 = connector->modes;
          qLcKmsDebug();
          if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
              0) {
            local_188._0_4_ = 2;
            local_188._4_4_ = 0;
            local_188._8_4_ = 0;
            local_188._12_4_ = 0;
            local_188._16_4_ = 0;
            local_188._20_4_ = 0;
            uStack_170 = qLcKmsDebug::category.name;
            QMessageLogger::debug();
            pQVar29 = QDebug::operator<<((QDebug *)&local_1f8.shared,"mode");
            pQVar29 = QDebug::operator<<(pQVar29,(int)lVar30);
            pQVar29 = QDebug::operator<<(pQVar29,*(unsigned_short *)(p_Var4->name + lVar28 + -0x20))
            ;
            pQVar29 = QDebug::operator<<(pQVar29,"x");
            pQVar29 = QDebug::operator<<(pQVar29,*(unsigned_short *)(p_Var4->name + lVar28 + -0x16))
            ;
            pQVar29 = QDebug::operator<<(pQVar29,'@');
            pQVar29 = QDebug::operator<<(pQVar29,*(uint *)(p_Var4->name + lVar28 + -0xc));
            QDebug::operator<<(pQVar29,"hz");
            QDebug::~QDebug((QDebug *)&local_1f8.shared);
          }
          QList<_drmModeModeInfo>::emplaceBack<_drmModeModeInfo_const&>
                    ((QList<_drmModeModeInfo> *)&local_2b8,
                     (_drmModeModeInfo *)(connector->modes->name + lVar28 + -0x24));
          lVar28 = lVar28 + 0x44;
        }
        uVar47 = local_2b8.size & 0xffffffff;
        uVar40 = (uint)local_260;
        uVar11 = local_260._4_4_;
        uVar48 = 0xffffffffffffffff;
        local_3c0 = 0xffffffff;
        uVar41 = 0xffffffff;
        __range5 = (QList<QKmsPlane> *)0xffffffff;
        while( true ) {
          uVar39 = (uint)uVar41;
          uVar47 = uVar47 - 1;
          uVar46 = (uint)uVar47;
          if ((int)uVar46 < 0) break;
          __s2 = p_Var10 + (uVar46 & 0x7fffffff);
          if (((bVar6) && (uVar40 == __s2->hdisplay)) && (uVar11 == __s2->vdisplay)) {
            if (__s2->vrefresh == iVar24) {
              local_3c0 = uVar46;
            }
            if (iVar24 == 0) {
              local_3c0 = uVar46;
            }
          }
          iVar26 = bcmp(&local_1d8,__s2,0x44);
          if (iVar26 == 0) {
            uVar41 = uVar47 & 0xffffffff;
          }
          if ((__s2->type & 8) != 0) {
            __range5._0_4_ = uVar46;
          }
          __range5 = (QList<QKmsPlane> *)(ulong)(uint)__range5;
          uVar48 = uVar47 & 0xffffffff;
        }
        if (bVar7) {
          QList<_drmModeModeInfo>::emplaceBack<_drmModeModeInfo_const&>
                    ((QList<_drmModeModeInfo> *)&local_2b8,&configurationModeline);
          local_3c0 = (int)local_2b8.size - 1;
        }
        if (((int)uVar39 < 0) && (local_1d8._0_4_ != 0)) {
          QList<_drmModeModeInfo>::emplaceBack<_drmModeModeInfo_const&>
                    ((QList<_drmModeModeInfo> *)&local_2b8,(_drmModeModeInfo *)&local_1d8);
          uVar39 = (int)local_2b8.size - 1;
        }
        if (bVar8) {
          local_3c0 = uVar39;
        }
        if (((((int)local_3c0 < 0) && (local_3c0 = (uint)__range5, (int)(uint)__range5 < 0)) &&
            (local_3c0 = uVar39, (int)uVar39 < 0)) && (local_3c0 = (uint)uVar48, (int)local_3c0 < 0)
           ) {
          local_188._0_4_ = 2;
          local_188._20_4_ = 0;
          local_188._4_4_ = 0;
          local_188._8_4_ = 0;
          local_188._12_4_ = 0;
          local_188._16_4_ = 0;
          uStack_170 = "default";
          QMessageLogger::warning();
          pQVar29 = QDebug::operator<<((QDebug *)&local_1f8.shared,"No modes available for output");
          QDebug::operator<<(pQVar29,(QByteArray *)&local_258);
          QDebug::~QDebug((QDebug *)&local_1f8.shared);
          pQVar37 = (QPlatformScreen *)0x0;
        }
        else {
          p_Var31 = QList<_drmModeModeInfo>::data((QList<_drmModeModeInfo> *)&local_2b8);
          uVar1 = p_Var31[local_3c0].hdisplay;
          p_Var31 = QList<_drmModeModeInfo>::data((QList<_drmModeModeInfo> *)&local_2b8);
          uVar2 = p_Var31[local_3c0].vdisplay;
          p_Var31 = QList<_drmModeModeInfo>::data((QList<_drmModeModeInfo> *)&local_2b8);
          uVar27 = p_Var31[local_3c0].vrefresh;
          qLcKmsDebug();
          if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
              0) {
            local_188._0_4_ = 2;
            local_188._4_4_ = 0;
            local_188._8_4_ = 0;
            local_188._12_4_ = 0;
            local_188._16_4_ = 0;
            local_188._20_4_ = 0;
            uStack_170 = qLcKmsDebug::category.name;
            QMessageLogger::debug();
            pQVar29 = QDebug::operator<<((QDebug *)&local_1f8.shared,"Selected mode");
            pQVar29 = QDebug::operator<<(pQVar29,local_3c0);
            pQVar29 = QDebug::operator<<(pQVar29,":");
            pQVar29 = QDebug::operator<<(pQVar29,(uint)uVar1);
            pQVar29 = QDebug::operator<<(pQVar29,"x");
            pQVar29 = QDebug::operator<<(pQVar29,(uint)uVar2);
            pQVar29 = QDebug::operator<<(pQVar29,'@');
            pQVar29 = QDebug::operator<<(pQVar29,uVar27);
            pQVar29 = QDebug::operator<<(pQVar29,"hz for output");
            QDebug::operator<<(pQVar29,(QByteArray *)&local_258);
            QDebug::~QDebug((QDebug *)&local_1f8.shared);
          }
          iVar24 = qEnvironmentVariableIntValue("QT_QPA_EGLFS_PHYSICAL_WIDTH",(bool *)0x0);
          if (iVar24 == 0) {
            iVar24 = qEnvironmentVariableIntValue("QT_QPA_PHYSICAL_WIDTH",(bool *)0x0);
          }
          iVar26 = qEnvironmentVariableIntValue("QT_QPA_EGLFS_PHYSICAL_HEIGHT",(bool *)0x0);
          if (iVar26 == 0) {
            iVar26 = qEnvironmentVariableIntValue("QT_QPA_PHYSICAL_HEIGHT",(bool *)0x0);
          }
          local_2e8 = (double)iVar24;
          dStack_2e0 = (double)iVar26;
          if (iVar24 < 1 || iVar26 < 1) {
            local_308.d = (Data *)0x0;
            local_308.ptr = (char16_t *)0x0;
            local_2d8.d = (Data *)0x0;
            local_2d8.ptr = L"physicalWidth";
            local_308.size = 0;
            local_1f8._16_4_ = 0;
            local_1f8._20_4_ = 0;
            local_2d8.size = 0xd;
            local_1f8._0_4_ = 0.0;
            local_1f8._4_4_ = 0;
            local_1f8._8_4_ = 0;
            local_1f8._12_4_ = 0;
            local_1e0 = (char *)0x2;
            QMap<QString,_QVariant>::value
                      ((QVariant *)local_188,&userConnectorConfig,(QString *)&local_2d8,
                       (QVariant *)&local_1f8);
            iVar24 = QVariant::toInt((bool *)local_188);
            local_350._8_8_ = 0.0;
            pQStack_340 = (QString *)0x0;
            local_328.d = (Data *)0x0;
            local_338 = 0;
            local_328.ptr = L"physicalHeight";
            local_328.size = 0xe;
            local_238.shared = (PrivateShared *)0x0;
            local_238._8_8_ = 0;
            local_238._16_8_ = 0;
            local_220 = 2;
            QMap<QString,_QVariant>::value
                      ((QVariant *)local_218,&userConnectorConfig,(QString *)&local_328,
                       (QVariant *)&local_238);
            iVar26 = QVariant::toInt((bool *)local_218);
            local_2e8 = (double)iVar24;
            dStack_2e0 = (double)iVar26;
            QVariant::~QVariant((QVariant *)local_218);
            QVariant::~QVariant((QVariant *)&local_238);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_328);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)(local_350 + 8));
            QVariant::~QVariant((QVariant *)local_188);
            QVariant::~QVariant((QVariant *)&local_1f8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2d8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_308);
            if ((local_2e8 <= 0.0) || (dStack_2e0 <= 0.0)) {
              uVar48._0_4_ = connector->mmWidth;
              uVar48._4_4_ = connector->mmHeight;
              auVar50._0_8_ = uVar48 & 0xffffffff;
              auVar50._8_4_ = uVar48._4_4_;
              auVar50._12_4_ = 0;
              local_2e8 = SUB168(auVar50 | _DAT_00121aa0,0) - (double)DAT_00121aa0;
              dStack_2e0 = SUB168(auVar50 | _DAT_00121aa0,8) - DAT_00121aa0._8_8_;
            }
          }
          qLcKmsDebug();
          if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
              0) {
            local_188._0_4_ = 2;
            local_188._4_4_ = 0;
            local_188._8_4_ = 0;
            local_188._12_4_ = 0;
            local_188._16_4_ = 0;
            local_188._20_4_ = 0;
            uStack_170 = qLcKmsDebug::category.name;
            QMessageLogger::debug();
            pQVar29 = QDebug::operator<<((QDebug *)local_218,"Physical size is");
            local_350._0_8_ = pQVar29->stream;
            *(int *)(local_350._0_8_ + 0x28) = *(int *)(local_350._0_8_ + 0x28) + 1;
            ::operator<<((Stream *)&local_1f8,(QSizeF *)local_350);
            pQVar29 = QDebug::operator<<((QDebug *)&local_1f8,"mm");
            pQVar29 = QDebug::operator<<(pQVar29,"for output");
            QDebug::operator<<(pQVar29,(QByteArray *)&local_258);
            QDebug::~QDebug((QDebug *)&local_1f8);
            QDebug::~QDebug((QDebug *)local_350);
            QDebug::~QDebug((QDebug *)local_218);
          }
          local_218._16_8_ = -0x5555555555555556;
          local_218._0_8_ = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
          local_218._8_8_ = (char16_t *)0xaaaaaaaaaaaaaaaa;
          local_2d8.d = (Data *)0x0;
          local_308.d = (Data *)0x0;
          local_308.ptr = (char16_t *)0x0;
          local_308.size = 0;
          local_2d8.ptr = L"format";
          local_2d8.size = 6;
          local_328.d = (Data *)0x0;
          local_328.ptr = (char16_t *)0x0;
          local_328.size = 0;
          QVariant::QVariant((QVariant *)&local_1f8,(QString *)&local_328);
          QMap<QString,_QVariant>::value
                    ((QVariant *)local_188,&userConnectorConfig,(QString *)&local_2d8,
                     (QVariant *)&local_1f8);
          QVariant::toByteArray();
          QByteArray::toLower_helper((QByteArray *)local_218);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_238);
          QVariant::~QVariant((QVariant *)local_188);
          QVariant::~QVariant((QVariant *)&local_1f8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_328);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2d8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_308);
          uVar40 = 0x34325258;
          bVar19 = false;
          if (local_218._16_8_ != 0) {
            local_188._0_4_ = 0x121c56;
            local_188._4_4_ = 0;
            bVar22 = operator==((QByteArray *)local_218,(char **)local_188);
            bVar19 = true;
            if (!bVar22) {
              local_188._0_4_ = 0x121c5f;
              local_188._4_4_ = 0;
              bVar22 = operator==((QByteArray *)local_218,(char **)local_188);
              uVar40 = 0x34324258;
              if (!bVar22) {
                local_188._0_4_ = 0x121c68;
                local_188._4_4_ = 0;
                bVar22 = operator==((QByteArray *)local_218,(char **)local_188);
                uVar40 = 0x34325241;
                if (!bVar22) {
                  local_188._0_4_ = 0x121c71;
                  local_188._4_4_ = 0;
                  bVar22 = operator==((QByteArray *)local_218,(char **)local_188);
                  uVar40 = 0x34324241;
                  if (!bVar22) {
                    local_188._0_4_ = 0x121c7a;
                    local_188._4_4_ = 0;
                    bVar22 = operator==((QByteArray *)local_218,(char **)local_188);
                    uVar40 = 0x36314752;
                    if (!bVar22) {
                      local_188._0_4_ = 0x121c81;
                      local_188._4_4_ = 0;
                      bVar22 = operator==((QByteArray *)local_218,(char **)local_188);
                      uVar40 = 0x36314742;
                      if (!bVar22) {
                        local_188._0_4_ = 0x121c88;
                        local_188._4_4_ = 0;
                        bVar22 = operator==((QByteArray *)local_218,(char **)local_188);
                        uVar40 = 0x30335258;
                        if (!bVar22) {
                          local_188._0_4_ = 0x121c94;
                          local_188._4_4_ = 0;
                          bVar22 = operator==((QByteArray *)local_218,(char **)local_188);
                          uVar40 = 0x30334258;
                          if (!bVar22) {
                            local_188._0_4_ = 0x121ca0;
                            local_188._4_4_ = 0;
                            bVar22 = operator==((QByteArray *)local_218,(char **)local_188);
                            uVar40 = 0x30335241;
                            if (!bVar22) {
                              local_188._0_4_ = 0x121cac;
                              local_188._4_4_ = 0;
                              bVar22 = operator==((QByteArray *)local_218,(char **)local_188);
                              uVar40 = 0x30334241;
                              if (!bVar22) {
                                local_188._0_4_ = 2;
                                local_188._20_4_ = 0;
                                local_188._4_4_ = 0;
                                local_188._8_4_ = 0;
                                local_188._12_4_ = 0;
                                local_188._16_4_ = 0;
                                uStack_170 = "default";
                                pcVar45 = (char16_t *)local_218._8_8_;
                                if ((char16_t *)local_218._8_8_ == (char16_t *)0x0) {
                                  pcVar45 = (char16_t *)&QByteArray::_empty;
                                }
                                pcVar42 = local_258.ptr;
                                if (local_258.ptr == (char *)0x0) {
                                  pcVar42 = (char *)&QByteArray::_empty;
                                }
                                bVar19 = false;
                                QMessageLogger::warning
                                          (local_188,"Invalid pixel format \"%s\" for output %s",
                                           pcVar45,pcVar42);
                                uVar40 = 0x34325258;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          qLcKmsDebug();
          if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
              0) {
            local_188._0_4_ = 2;
            local_188._4_4_ = 0;
            local_188._8_4_ = 0;
            local_188._12_4_ = 0;
            local_188._16_4_ = 0;
            local_188._20_4_ = 0;
            uStack_170 = qLcKmsDebug::category.name;
            QMessageLogger::debug();
            pQVar29 = QDebug::operator<<((QDebug *)&local_1f8.shared,"Format is");
            Qt::hex((QTextStream *)pQVar29->stream);
            pQVar29 = QDebug::operator<<(pQVar29,uVar40);
            Qt::dec((QTextStream *)pQVar29->stream);
            pQVar29 = QDebug::operator<<(pQVar29,"requested_by_user =");
            pQVar29 = QDebug::operator<<(pQVar29,bVar19);
            pQVar29 = QDebug::operator<<(pQVar29,"for output");
            QDebug::operator<<(pQVar29,(QByteArray *)&local_258);
            QDebug::~QDebug((QDebug *)&local_1f8.shared);
          }
          local_238._16_8_ = -0x5555555555555556;
          local_238.shared = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
          local_238._8_8_ = 0xaaaaaaaaaaaaaaaa;
          local_308.d = (Data *)0x0;
          local_308.ptr = (char16_t *)0x0;
          local_2d8.d = (Data *)0x0;
          local_308.size = 0;
          local_2d8.ptr = L"clones";
          local_2d8.size = 6;
          local_1f8._0_4_ = 0;
          local_1f8._4_4_ = 0;
          local_1f8._8_4_ = 0;
          local_1f8._12_4_ = 0;
          local_1f8._16_4_ = 0;
          local_1f8._20_4_ = 0;
          local_1e0 = (char *)0x2;
          QMap<QString,_QVariant>::value
                    ((QVariant *)local_188,&userConnectorConfig,(QString *)&local_2d8,
                     (QVariant *)&local_1f8);
          QVariant::toString();
          QVariant::~QVariant((QVariant *)local_188);
          QVariant::~QVariant((QVariant *)&local_1f8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2d8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_308);
          if ((local_238._16_8_ != 0) &&
             (qLcKmsDebug(),
             ((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0
             )) {
            local_188._0_4_ = 2;
            local_188._4_4_ = 0;
            local_188._8_4_ = 0;
            local_188._12_4_ = 0;
            local_188._16_4_ = 0;
            local_188._20_4_ = 0;
            uStack_170 = qLcKmsDebug::category.name;
            QMessageLogger::debug();
            pQVar29 = QDebug::operator<<((QDebug *)&local_1f8.shared,"Output");
            pQVar29 = QDebug::operator<<(pQVar29,(QByteArray *)&local_258);
            pQVar29 = QDebug::operator<<(pQVar29," clones output ");
            QDebug::operator<<(pQVar29,(QString *)&local_238);
            QDebug::~QDebug((QDebug *)&local_1f8.shared);
          }
          local_358.wd.m_i = -1;
          local_358.ht.m_i = -1;
          local_2d8.size = -0x5555555555555556;
          local_2d8.d = (Data *)0xaaaaaaaaaaaaaaaa;
          local_2d8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
          local_350._8_8_ = 0.0;
          pQStack_340 = (QString *)0x0;
          local_328.d = (Data *)0x0;
          local_338 = 0;
          local_328.ptr = L"size";
          local_328.size = 4;
          local_1f8._0_4_ = 0;
          local_1f8._4_4_ = 0;
          local_1f8._8_4_ = 0;
          local_1f8._12_4_ = 0;
          local_1f8._16_4_ = 0;
          local_1f8._20_4_ = 0;
          local_1e0 = (char *)0x2;
          QMap<QString,_QVariant>::value
                    ((QVariant *)local_188,&userConnectorConfig,(QString *)&local_328,
                     (QVariant *)&local_1f8);
          QVariant::toByteArray();
          QByteArray::toLower_helper((QByteArray *)&local_2d8);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_308);
          QVariant::~QVariant((QVariant *)local_188);
          QVariant::~QVariant((QVariant *)&local_1f8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_328);
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)(local_350 + 8));
          if (local_2d8.size == 0) {
LAB_001165a9:
            p_Var31 = QList<_drmModeModeInfo>::data((QList<_drmModeModeInfo> *)&local_2b8);
            QVar9 = local_358;
            local_358.wd.m_i._2_2_ = 0;
            local_358.wd.m_i._0_2_ = p_Var31[local_3c0].hdisplay;
            local_358.ht = QVar9.ht.m_i;
            p_Var31 = QList<_drmModeModeInfo>::data((QList<_drmModeModeInfo> *)&local_2b8);
            local_358.ht.m_i._0_2_ = p_Var31[local_3c0].vdisplay;
            local_358.ht.m_i._2_2_ = 0;
          }
          else {
            pcVar45 = local_2d8.ptr;
            if (local_2d8.ptr == (char16_t *)0x0) {
              pcVar45 = (char16_t *)&QByteArray::_empty;
            }
            iVar24 = __isoc99_sscanf(pcVar45,"%dx%d",&local_358,&local_358.ht);
            if (iVar24 != 2) {
              local_188._0_4_ = 2;
              local_188._4_4_ = 0;
              local_188._8_4_ = 0;
              local_188._12_4_ = 0;
              local_188._16_4_ = 0;
              local_188._20_4_ = 0;
              uStack_170 = "default";
              pcVar45 = local_2d8.ptr;
              if (local_2d8.ptr == (char16_t *)0x0) {
                pcVar45 = (char16_t *)&QByteArray::_empty;
              }
              QMessageLogger::warning(local_188,"Invalid framebuffer size \'%s\'",pcVar45);
              goto LAB_001165a9;
            }
            if (this->m_has_atomic_support == false) {
              local_188._0_4_ = 2;
              local_188._20_4_ = 0;
              local_188._4_4_ = 0;
              local_188._8_4_ = 0;
              local_188._12_4_ = 0;
              local_188._16_4_ = 0;
              uStack_170 = "default";
              QMessageLogger::warning
                        (local_188,"Setting framebuffer size is only available with DRM atomic API")
              ;
              goto LAB_001165a9;
            }
          }
          qLcKmsDebug();
          if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
              0) {
            local_188._0_4_ = 2;
            local_188._4_4_ = 0;
            local_188._8_4_ = 0;
            local_188._12_4_ = 0;
            local_188._16_4_ = 0;
            local_188._20_4_ = 0;
            uStack_170 = qLcKmsDebug::category.name;
            QMessageLogger::debug();
            pQVar29 = QDebug::operator<<((QDebug *)&local_1f8.shared,"Output");
            pQVar29 = QDebug::operator<<(pQVar29,(QByteArray *)&local_258);
            pQVar32 = (QSize *)QDebug::operator<<(pQVar29,"framebuffer size is ");
            local_368 = *pQVar32;
            *(int *)((long)local_368 + 0x28) = *(int *)((long)local_368 + 0x28) + 1;
            ::operator<<((Stream *)local_360,&local_368);
            QDebug::~QDebug((QDebug *)local_360);
            QDebug::~QDebug((QDebug *)&local_368);
            QDebug::~QDebug((QDebug *)&local_1f8.shared);
          }
          memcpy(local_188,&DAT_001227d0,0x98);
          local_188._0_4_ = 0;
          local_188._4_4_ = 0;
          local_188._8_4_ = 0;
          local_188._12_4_ = 0;
          local_188._16_4_ = 0;
          local_188._20_4_ = 0;
          uStack_170 = (char *)0x0;
          local_168 = 0;
          local_160 = -1.0;
          qStack_158 = -1.0;
          local_150 = -NAN;
          local_148 = false;
          local_140 = (drmModeCrtcPtr)0x0;
          QStack_138.d = (Data *)0x0;
          QStack_138.ptr = (_drmModeModeInfo *)0x0;
          QStack_138.size = 0;
          local_120 = 1;
          local_104 = 0;
          local_100 = false;
          local_118 = (drmModePropertyPtr)0x0;
          p_Stack_110 = (drmModePropertyBlobPtr)0x0;
          local_108 = false;
          local_fc = 0x34325258;
          local_f8 = false;
          local_f0.d.d = (Data *)0x0;
          local_f0.d.ptr = (char16_t *)0x0;
          local_f0.d.size = 0;
          QStack_d8.d.d = (Data *)0x0;
          QStack_d8.d.ptr = (QKmsPlane *)0x0;
          QStack_d8.d.size = 0;
          local_c0 = (QKmsPlane *)0x0;
          local_b8.wd.m_i = -1;
          local_b8.ht.m_i = -1;
          local_b0 = (QKmsPlane *)0x0;
          QStack_a8.wd.m_i = 0;
          QStack_a8.ht.m_i = 0;
          QString::fromUtf8<void>((QString *)&local_1f8,(QByteArray *)&local_258);
          uVar17 = local_188._20_4_;
          uVar16 = local_188._16_4_;
          uVar15 = local_188._12_4_;
          uVar14 = local_188._8_4_;
          uVar13 = local_188._4_4_;
          uVar12 = local_188._0_4_;
          local_188._0_4_ = local_1f8._0_4_;
          local_188._4_4_ = local_1f8._4_4_;
          local_188._8_4_ = local_1f8._8_4_;
          local_188._12_4_ = local_1f8._12_4_;
          local_1f8._0_4_ = uVar12;
          local_1f8._4_4_ = uVar13;
          local_1f8._8_4_ = uVar14;
          local_1f8._12_4_ = uVar15;
          local_188._16_4_ = local_1f8._16_4_;
          local_188._20_4_ = local_1f8._20_4_;
          local_1f8._16_4_ = uVar16;
          local_1f8._20_4_ = uVar17;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1f8)
          ;
          uStack_170 = (char *)CONCAT44(uVar23,connector->connector_id);
          local_160 = local_2e8;
          qStack_158 = dStack_2e0;
          if ((int)(uint)__range5 < 0) {
            __range5._0_4_ = local_3c0;
          }
          local_150 = (qreal)CONCAT44(local_3c0,(uint)__range5);
          local_148 = false;
          local_168 = uVar25;
          local_140 = (drmModeCrtcPtr)drmModeGetCrtc(this->m_dri_fd,uVar25);
          QArrayDataPointer<_drmModeModeInfo>::operator=(&QStack_138,&local_2b8);
          local_120 = connector->subpixel;
          local_1f8._0_4_ = 0;
          local_1f8._4_4_ = 0;
          local_308.d = (Data *)0x0;
          local_308.ptr = (char16_t *)0x0;
          local_308.size = 0;
          local_1f8._8_4_ = 0x121d87;
          local_1f8._12_4_ = 0;
          local_1f8._16_4_ = 4;
          local_1f8._20_4_ = 0;
          local_118 = connectorProperty(this,connector,(QByteArray *)&local_1f8);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_1f8);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_308);
          local_1f8._0_4_ = 0.0;
          local_1f8._4_4_ = 0;
          local_308.d = (Data *)0x0;
          local_308.ptr = (char16_t *)0x0;
          local_1f8._8_4_ = 0x121d8c;
          local_1f8._12_4_ = 0;
          local_308.size = 0;
          local_1f8._16_4_ = 4;
          local_1f8._20_4_ = 0;
          p_Stack_110 = connectorPropertyBlob(this,connector,(QByteArray *)&local_1f8);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_1f8);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_308);
          local_108 = false;
          local_104 = 0;
          local_100 = false;
          local_fc = uVar40;
          local_f8 = bVar19;
          QString::operator=(&local_f0,(QString *)&local_238);
          local_b8 = local_358;
          iVar24 = this->m_dri_fd;
          p_Var31 = QList<_drmModeModeInfo>::data((QList<_drmModeModeInfo> *)&local_2b8);
          iVar24 = drmModeCreatePropertyBlob(iVar24,p_Var31 + local_3c0,0x44,&QStack_a8.ht);
          if ((iVar24 != 0) &&
             (qLcKmsDebug(),
             ((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0
             )) {
            local_1f8._0_4_ = 2.8026e-45;
            local_1f8._4_4_ = 0;
            local_1f8._8_4_ = 0;
            local_1f8._12_4_ = 0;
            local_1f8._16_4_ = 0;
            local_1f8._20_4_ = 0;
            local_1e0 = qLcKmsDebug::category.name;
            QMessageLogger::debug();
            pQVar29 = QDebug::operator<<((QDebug *)&local_308,"Failed to create mode blob for mode")
            ;
            QDebug::operator<<(pQVar29,local_3c0);
            QDebug::~QDebug((QDebug *)&local_308);
          }
          parseConnectorProperties(this,(uint32_t)uStack_170,(QKmsOutput *)local_188);
          parseCrtcProperties(this,local_168,(QKmsOutput *)local_188);
          local_308.d = (Data *)0x0;
          local_308.ptr = (char16_t *)0x0;
          local_308.size = 0;
          this_00 = &this->m_planes;
          iVar33 = QList<QKmsPlane>::begin(this_00);
          iVar34 = QList<QKmsPlane>::end(this_00);
          for (; iVar33.i != iVar34.i; iVar33.i = iVar33.i + 1) {
            if (((uint)(iVar33.i)->possibleCrtcs >> (uStack_170._4_4_ & 0x1f) & 1) != 0) {
              QList<QKmsPlane>::emplaceBack<QKmsPlane_const&>(&QStack_d8,iVar33.i);
              QString::number((uint)&local_1f8,(iVar33.i)->id);
              QString::append((QString *)&local_308);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_1f8);
              QString::append((QChar)(char16_t)&local_308);
              if (((local_c0 == (QKmsPlane *)0x0) && ((iVar33.i)->type == PrimaryPlane)) &&
                 ((iVar33.i)->activeCrtcId == 0)) {
                (iVar33.i)->activeCrtcId = local_168;
                local_c0 = iVar33.i;
              }
            }
          }
          qLcKmsDebug();
          qVar18 = QStack_d8.d.size;
          if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
              0) {
            local_1f8._0_4_ = 2.8026e-45;
            local_1f8._20_4_ = 0;
            local_1f8._4_4_ = 0;
            local_1f8._8_4_ = 0;
            local_1f8._12_4_ = 0;
            local_1f8._16_4_ = 0;
            local_1e0 = qLcKmsDebug::category.name;
            pcVar42 = local_258.ptr;
            if (local_258.ptr == (char *)0x0) {
              pcVar42 = (char *)&QByteArray::_empty;
            }
            QString::toLocal8Bit((QByteArray *)&local_328,(QString *)&local_308);
            pcVar45 = local_328.ptr;
            if (local_328.ptr == (char16_t *)0x0) {
              pcVar45 = (char16_t *)&QByteArray::_empty;
            }
            QMessageLogger::debug
                      ((char *)local_1f8.data,"Output %s can use %d planes: %s",pcVar42,
                       qVar18 & 0xffffffff,pcVar45);
            QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_328);
          }
          ok = true;
          uVar23 = qEnvironmentVariableIntValue("QT_QPA_EGLFS_KMS_PLANE_INDEX",&ok);
          if ((ok != false) &&
             (piVar35 = (int *)drmModeGetPlaneResources(this->m_dri_fd), piVar35 != (int *)0x0)) {
            if (((int)uVar23 < 0) || (*piVar35 <= (int)uVar23)) {
              local_1f8._0_4_ = 2.8026e-45;
              local_1f8._20_4_ = 0;
              local_1f8._4_4_ = 0;
              local_1f8._8_4_ = 0;
              local_1f8._12_4_ = 0;
              local_1f8._16_4_ = 0;
              local_1e0 = "default";
              QMessageLogger::warning
                        ((char *)local_1f8.data,"Invalid plane index %d, must be between 0 and %u",
                         (ulong)uVar23,(ulong)(*piVar35 - 1));
            }
            else {
              lVar28 = drmModeGetPlane(this->m_dri_fd,
                                       *(undefined4 *)(*(long *)(piVar35 + 2) + (ulong)uVar23 * 4));
              if (lVar28 != 0) {
                local_108 = true;
                local_104 = *(uint32_t *)(lVar28 + 0x10);
                qLcKmsDebug();
                if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i &
                    1) != 0) {
                  local_1f8._0_4_ = 2.8026e-45;
                  local_1f8._20_4_ = 0;
                  local_1f8._4_4_ = 0;
                  local_1f8._8_4_ = 0;
                  local_1f8._12_4_ = 0;
                  local_1f8._16_4_ = 0;
                  local_1e0 = qLcKmsDebug::category.name;
                  QMessageLogger::debug
                            ((char *)local_1f8.data,
                             "Forcing plane index %d, plane id %u (belongs to crtc id %u)",
                             (ulong)uVar23,(ulong)*(uint *)(lVar28 + 0x10),
                             (ulong)*(uint *)(lVar28 + 0x14));
                }
                iVar33 = QList<QKmsPlane>::begin(this_00);
                iVar34 = QList<QKmsPlane>::end(this_00);
                for (; iVar33.i != iVar34.i; iVar33.i = iVar33.i + 1) {
                  if ((iVar33.i)->id == local_104) {
                    if (local_c0 != (QKmsPlane *)0x0) {
                      local_c0->activeCrtcId = 0;
                    }
                    (iVar33.i)->activeCrtcId = local_168;
                    local_c0 = iVar33.i;
                    break;
                  }
                }
                drmModeFreePlane(lVar28);
              }
            }
          }
          cVar21 = qEnvironmentVariableIsSet("QT_QPA_EGLFS_KMS_PLANES_FOR_CRTCS");
          if (cVar21 != '\0') {
            local_328.size = -0x5555555555555556;
            local_328.d = (Data *)0xaaaaaaaaaaaaaaaa;
            local_328.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
            qEnvironmentVariable((char *)&local_328);
            qLcKmsDebug();
            if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1)
                != 0) {
              local_1f8._0_4_ = 2;
              local_1f8._4_4_ = 0;
              local_1f8._8_4_ = 0;
              local_1f8._12_4_ = 0;
              local_1f8._16_4_ = 0;
              local_1f8._20_4_ = 0;
              local_1e0 = qLcKmsDebug::category.name;
              QString::toLocal8Bit((QByteArray *)(local_350 + 8),(QString *)&local_328);
              pQVar38 = pQStack_340;
              if (pQStack_340 == (QString *)0x0) {
                pQVar38 = (QString *)&QByteArray::_empty;
              }
              QMessageLogger::debug
                        ((char *)local_1f8.data,"crtc_id:plane_id override list: %s",pQVar38);
              QArrayDataPointer<char>::~QArrayDataPointer
                        ((QArrayDataPointer<char> *)(local_350 + 8));
            }
            local_1f8._16_4_ = 0xaaaaaaaa;
            local_1f8._20_4_ = 0xaaaaaaaa;
            local_1f8._0_4_ = -3.0316488e-13;
            local_1f8._4_4_ = 0xaaaaaaaa;
            local_1f8._8_4_ = 0xaaaaaaaa;
            local_1f8._12_4_ = 0xaaaaaaaa;
            QString::split(&local_1f8,&local_328,0x3a,0,1);
            lVar28 = CONCAT44(local_1f8._12_4_,local_1f8._8_4_);
            lVar30 = CONCAT44(local_1f8._20_4_,local_1f8._16_4_) * 0x18 + lVar28;
            for (; lVar28 != lVar30; lVar28 = lVar28 + 0x18) {
              local_338 = -0x5555555555555556;
              local_350._8_8_ = -3.7206620809969885e-103;
              pQStack_340 = (QString *)0xaaaaaaaaaaaaaaaa;
              QString::split((QArrayDataPointer<QString> *)(local_350 + 8),lVar28,0x2c,0,1);
              if ((local_338 == 2) &&
                 (uVar27 = QString::toInt(pQStack_340,(bool *)0x0,10), uVar27 == local_168)) {
                uVar27 = QString::toInt(pQStack_340 + 1,(bool *)0x0,10);
                iVar33 = QList<QKmsPlane>::begin(this_00);
                iVar34 = QList<QKmsPlane>::end(this_00);
                for (; iVar33.i != iVar34.i; iVar33.i = iVar33.i + 1) {
                  if ((iVar33.i)->id == uVar27) {
                    if (local_c0 != (QKmsPlane *)0x0) {
                      local_c0->activeCrtcId = 0;
                    }
                    (iVar33.i)->activeCrtcId = local_168;
                    local_c0 = iVar33.i;
                    break;
                  }
                }
              }
              QArrayDataPointer<QString>::~QArrayDataPointer
                        ((QArrayDataPointer<QString> *)(local_350 + 8));
            }
            QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_1f8)
            ;
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_328);
          }
          if (local_c0 == (QKmsPlane *)0x0) {
            pQVar36 = (QKmsPlane *)0x0;
          }
          else {
            qLcKmsDebug();
            pQVar36 = local_c0;
            if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1)
                != 0) {
              local_1f8._0_4_ = 2.8026e-45;
              local_1f8._4_4_ = 0;
              local_1f8._8_4_ = 0;
              local_1f8._12_4_ = 0;
              local_1f8._16_4_ = 0;
              local_1f8._20_4_ = 0;
              local_1e0 = qLcKmsDebug::category.name;
              pcVar42 = local_258.ptr;
              if (local_258.ptr == (char *)0x0) {
                pcVar42 = (char *)&QByteArray::_empty;
              }
              QMessageLogger::debug
                        ((char *)local_1f8.data,
                         "Chose plane %u for output %s (crtc id %u) (may not be applicable)",
                         (ulong)local_c0->id,pcVar42,(ulong)local_168);
              pQVar36 = local_c0;
            }
          }
          if (((this->m_has_atomic_support == true) && (pQVar36 == (QKmsPlane *)0x0)) &&
             (qLcKmsDebug(),
             ((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0
             )) {
            local_1f8._0_4_ = 2.8026e-45;
            local_1f8._20_4_ = 0;
            local_1f8._4_4_ = 0;
            local_1f8._8_4_ = 0;
            local_1f8._12_4_ = 0;
            local_1f8._16_4_ = 0;
            local_1e0 = qLcKmsDebug::category.name;
            pcVar42 = local_258.ptr;
            if (local_258.ptr == (char *)0x0) {
              pcVar42 = (char *)&QByteArray::_empty;
            }
            QMessageLogger::debug
                      ((char *)local_1f8.data,
                       "No plane associated with output %s (crtc id %u) and atomic modesetting is enabled. This is bad."
                       ,pcVar42,(ulong)local_168);
          }
          this->m_crtc_allocator = this->m_crtc_allocator | 1 << (uStack_170._4_1_ & 0x1f);
          QKmsOutput::operator=(&vinfo->output,(QKmsOutput *)local_188);
          iVar24 = (*this->_vptr_QKmsDevice[5])(this,(QKmsOutput *)local_188);
          pQVar37 = (QPlatformScreen *)CONCAT44(extraout_var,iVar24);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_308);
          QKmsOutput::~QKmsOutput((QKmsOutput *)local_188);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_2d8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_238)
          ;
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_218);
        }
        QArrayDataPointer<_drmModeModeInfo>::~QArrayDataPointer(&local_2b8);
        goto LAB_00116fb7;
      }
      qLcKmsDebug();
      if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
        local_188._0_4_ = 2;
        local_188._4_4_ = 0;
        local_188._8_4_ = 0;
        local_188._12_4_ = 0;
        local_188._16_4_ = 0;
        local_188._20_4_ = 0;
        uStack_170 = qLcKmsDebug::category.name;
        QMessageLogger::debug();
        pcVar42 = "Skipping output";
        goto LAB_0011547f;
      }
    }
LAB_0011573b:
    pQVar37 = (QPlatformScreen *)0x0;
  }
LAB_00116fb7:
  QArrayDataPointer<char>::~QArrayDataPointer(&local_298);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&userConnectorConfig.d);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2
            ((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>_>_>
              *)local_270);
LAB_00116fde:
  QArrayDataPointer<char>::~QArrayDataPointer(&local_258);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return pQVar37;
  }
  __stack_chk_fail();
}

Assistant:

QPlatformScreen *QKmsDevice::createScreenForConnector(drmModeResPtr resources,
                                                      drmModeConnectorPtr connector,
                                                      ScreenInfo *vinfo)
{
    Q_ASSERT(vinfo);
    const QByteArray connectorName = nameForConnector(connector);

    const int crtc = crtcForConnector(resources, connector);
    if (crtc < 0) {
        qWarning() << "No usable crtc/encoder pair for connector" << connectorName;
        return nullptr;
    }

    OutputConfiguration configuration;
    QSize configurationSize;
    int configurationRefresh = 0;
    drmModeModeInfo configurationModeline;

    auto userConfig = m_screenConfig->outputSettings();
    QVariantMap userConnectorConfig = userConfig.value(QString::fromUtf8(connectorName));
    // default to the preferred mode unless overridden in the config
    const QByteArray mode = userConnectorConfig.value(QStringLiteral("mode"), QStringLiteral("preferred"))
        .toByteArray().toLower();
    if (mode == "off") {
        configuration = OutputConfigOff;
    } else if (mode == "preferred") {
        configuration = OutputConfigPreferred;
    } else if (mode == "current") {
        configuration = OutputConfigCurrent;
    } else if (mode == "skip") {
        configuration = OutputConfigSkip;
    } else if (sscanf(mode.constData(), "%dx%d@%d", &configurationSize.rwidth(), &configurationSize.rheight(),
                      &configurationRefresh) == 3)
    {
        configuration = OutputConfigMode;
    } else if (sscanf(mode.constData(), "%dx%d", &configurationSize.rwidth(), &configurationSize.rheight()) == 2) {
        configuration = OutputConfigMode;
    } else if (parseModeline(mode, &configurationModeline)) {
        configuration = OutputConfigModeline;
    } else {
        qWarning("Invalid mode \"%s\" for output %s", mode.constData(), connectorName.constData());
        configuration = OutputConfigPreferred;
    }

    *vinfo = ScreenInfo();
    vinfo->virtualIndex = userConnectorConfig.value(QStringLiteral("virtualIndex"), INT_MAX).toInt();
    if (userConnectorConfig.contains(QStringLiteral("virtualPos"))) {
        const QByteArray vpos = userConnectorConfig.value(QStringLiteral("virtualPos")).toByteArray();
        const QByteArrayList vposComp = vpos.split(',');
        if (vposComp.size() == 2)
            vinfo->virtualPos = QPoint(vposComp[0].trimmed().toInt(), vposComp[1].trimmed().toInt());
    }
    if (userConnectorConfig.value(QStringLiteral("primary")).toBool())
        vinfo->isPrimary = true;

    const uint32_t crtc_id = resources->crtcs[crtc];

    if (configuration == OutputConfigOff) {
        qCDebug(qLcKmsDebug) << "Turning off output" << connectorName;
        drmModeSetCrtc(m_dri_fd, crtc_id, 0, 0, 0, 0, 0, nullptr);
        return nullptr;
    }

    // Skip disconnected output
    if (configuration == OutputConfigPreferred && connector->connection == DRM_MODE_DISCONNECTED) {
        qCDebug(qLcKmsDebug) << "Skipping disconnected output" << connectorName;
        return nullptr;
    }

    if (configuration == OutputConfigSkip) {
        qCDebug(qLcKmsDebug) << "Skipping output" << connectorName;
        return nullptr;
    }

    // Get the current mode on the current crtc
    drmModeModeInfo crtc_mode;
    memset(&crtc_mode, 0, sizeof crtc_mode);
    if (drmModeEncoderPtr encoder = drmModeGetEncoder(m_dri_fd, connector->encoder_id)) {
        drmModeCrtcPtr crtc = drmModeGetCrtc(m_dri_fd, encoder->crtc_id);
        drmModeFreeEncoder(encoder);

        if (!crtc)
            return nullptr;

        if (crtc->mode_valid)
            crtc_mode = crtc->mode;

        drmModeFreeCrtc(crtc);
    }

    QList<drmModeModeInfo> modes;
    modes.reserve(connector->count_modes);
    qCDebug(qLcKmsDebug) << connectorName << "mode count:" << connector->count_modes
                         << "crtc index:" << crtc << "crtc id:" << crtc_id;
    for (int i = 0; i < connector->count_modes; i++) {
        const drmModeModeInfo &mode = connector->modes[i];
        qCDebug(qLcKmsDebug) << "mode" << i << mode.hdisplay << "x" << mode.vdisplay
                                  << '@' << mode.vrefresh << "hz";
        modes << connector->modes[i];
    }

    int preferred = -1;
    int current = -1;
    int configured = -1;
    int best = -1;

    for (int i = modes.size() - 1; i >= 0; i--) {
        const drmModeModeInfo &m = modes.at(i);

        if (configuration == OutputConfigMode
                && m.hdisplay == configurationSize.width()
                && m.vdisplay == configurationSize.height()
                && (!configurationRefresh || m.vrefresh == uint32_t(configurationRefresh)))
        {
            configured = i;
        }

        if (!memcmp(&crtc_mode, &m, sizeof m))
            current = i;

        if (m.type & DRM_MODE_TYPE_PREFERRED)
            preferred = i;

        best = i;
    }

    if (configuration == OutputConfigModeline) {
        modes << configurationModeline;
        configured = modes.size() - 1;
    }

    if (current < 0 && crtc_mode.clock != 0) {
        modes << crtc_mode;
        current = modes.size() - 1;
    }

    if (configuration == OutputConfigCurrent)
        configured = current;

    int selected_mode = -1;

    if (configured >= 0)
        selected_mode = configured;
    else if (preferred >= 0)
        selected_mode = preferred;
    else if (current >= 0)
        selected_mode = current;
    else if (best >= 0)
        selected_mode = best;

    if (selected_mode < 0) {
        qWarning() << "No modes available for output" << connectorName;
        return nullptr;
    } else {
        int width = modes[selected_mode].hdisplay;
        int height = modes[selected_mode].vdisplay;
        int refresh = modes[selected_mode].vrefresh;
        qCDebug(qLcKmsDebug) << "Selected mode" << selected_mode << ":" << width << "x" << height
                                  << '@' << refresh << "hz for output" << connectorName;
    }

    // physical size from connector < config values < env vars
    int pwidth = qEnvironmentVariableIntValue("QT_QPA_EGLFS_PHYSICAL_WIDTH");
    if (!pwidth)
        pwidth = qEnvironmentVariableIntValue("QT_QPA_PHYSICAL_WIDTH");
    int pheight = qEnvironmentVariableIntValue("QT_QPA_EGLFS_PHYSICAL_HEIGHT");
    if (!pheight)
        pheight = qEnvironmentVariableIntValue("QT_QPA_PHYSICAL_HEIGHT");
    QSizeF physSize(pwidth, pheight);
    if (physSize.isEmpty()) {
        physSize = QSize(userConnectorConfig.value(QStringLiteral("physicalWidth")).toInt(),
                         userConnectorConfig.value(QStringLiteral("physicalHeight")).toInt());
        if (physSize.isEmpty()) {
            physSize.setWidth(connector->mmWidth);
            physSize.setHeight(connector->mmHeight);
        }
    }
    qCDebug(qLcKmsDebug) << "Physical size is" << physSize << "mm" << "for output" << connectorName;

    const QByteArray formatStr = userConnectorConfig.value(QStringLiteral("format"), QString())
            .toByteArray().toLower();
    uint32_t drmFormat;
    bool drmFormatExplicit = true;
    if (formatStr.isEmpty()) {
        drmFormat = DRM_FORMAT_XRGB8888;
        drmFormatExplicit = false;
    } else if (formatStr == "xrgb8888") {
        drmFormat = DRM_FORMAT_XRGB8888;
    } else if (formatStr == "xbgr8888") {
        drmFormat = DRM_FORMAT_XBGR8888;
    } else if (formatStr == "argb8888") {
        drmFormat = DRM_FORMAT_ARGB8888;
    } else if (formatStr == "abgr8888") {
        drmFormat = DRM_FORMAT_ABGR8888;
    } else if (formatStr == "rgb565") {
        drmFormat = DRM_FORMAT_RGB565;
    } else if (formatStr == "bgr565") {
        drmFormat = DRM_FORMAT_BGR565;
    } else if (formatStr == "xrgb2101010") {
        drmFormat = DRM_FORMAT_XRGB2101010;
    } else if (formatStr == "xbgr2101010") {
        drmFormat = DRM_FORMAT_XBGR2101010;
    } else if (formatStr == "argb2101010") {
        drmFormat = DRM_FORMAT_ARGB2101010;
    } else if (formatStr == "abgr2101010") {
        drmFormat = DRM_FORMAT_ABGR2101010;
    } else {
        qWarning("Invalid pixel format \"%s\" for output %s", formatStr.constData(), connectorName.constData());
        drmFormat = DRM_FORMAT_XRGB8888;
        drmFormatExplicit = false;
    }
    qCDebug(qLcKmsDebug) << "Format is" << Qt::hex << drmFormat << Qt::dec << "requested_by_user =" << drmFormatExplicit
                         << "for output" << connectorName;

    const QString cloneSource = userConnectorConfig.value(QStringLiteral("clones")).toString();
    if (!cloneSource.isEmpty())
        qCDebug(qLcKmsDebug) << "Output" << connectorName << " clones output " << cloneSource;

    QSize framebufferSize;
    bool framebufferSizeSet = false;
    const QByteArray fbsize = userConnectorConfig.value(QStringLiteral("size")).toByteArray().toLower();
    if (!fbsize.isEmpty()) {
        if (sscanf(fbsize.constData(), "%dx%d", &framebufferSize.rwidth(), &framebufferSize.rheight()) == 2) {
#if QT_CONFIG(drm_atomic)
            if (hasAtomicSupport())
                framebufferSizeSet = true;
#endif
            if (!framebufferSizeSet)
                qWarning("Setting framebuffer size is only available with DRM atomic API");
        } else {
            qWarning("Invalid framebuffer size '%s'", fbsize.constData());
        }
    }
    if (!framebufferSizeSet) {
        framebufferSize.setWidth(modes[selected_mode].hdisplay);
        framebufferSize.setHeight(modes[selected_mode].vdisplay);
    }

    qCDebug(qLcKmsDebug) << "Output" << connectorName << "framebuffer size is " << framebufferSize;

    QKmsOutput output;
    output.name = QString::fromUtf8(connectorName);
    output.connector_id = connector->connector_id;
    output.crtc_index = crtc;
    output.crtc_id = crtc_id;
    output.physical_size = physSize;
    output.preferred_mode = preferred >= 0 ? preferred : selected_mode;
    output.mode = selected_mode;
    output.mode_set = false;
    output.saved_crtc = drmModeGetCrtc(m_dri_fd, crtc_id);
    output.modes = modes;
    output.subpixel = connector->subpixel;
    output.dpms_prop = connectorProperty(connector, QByteArrayLiteral("DPMS"));
    output.edid_blob = connectorPropertyBlob(connector, QByteArrayLiteral("EDID"));
    output.wants_forced_plane = false;
    output.forced_plane_id = 0;
    output.forced_plane_set = false;
    output.drm_format = drmFormat;
    output.drm_format_requested_by_user = drmFormatExplicit;
    output.clone_source = cloneSource;
    output.size = framebufferSize;

#if QT_CONFIG(drm_atomic)
    if (drmModeCreatePropertyBlob(m_dri_fd, &modes[selected_mode], sizeof(drmModeModeInfo),
                                  &output.mode_blob_id) != 0) {
        qCDebug(qLcKmsDebug) << "Failed to create mode blob for mode" << selected_mode;
    }

    parseConnectorProperties(output.connector_id, &output);
    parseCrtcProperties(output.crtc_id, &output);
#endif

    QString planeListStr;
    for (QKmsPlane &plane : m_planes) {
        if (plane.possibleCrtcs & (1 << output.crtc_index)) {
            output.available_planes.append(plane);
            planeListStr.append(QString::number(plane.id));
            planeListStr.append(u' ');

            // Choose the first primary plane that is not already assigned to
            // another screen's associated crtc.
            if (!output.eglfs_plane && plane.type == QKmsPlane::PrimaryPlane && !plane.activeCrtcId)
                assignPlane(&output, &plane);
        }
    }
    qCDebug(qLcKmsDebug, "Output %s can use %d planes: %s",
            connectorName.constData(), int(output.available_planes.size()), qPrintable(planeListStr));

    // This is for the EGLDevice/EGLStream backend. On some of those devices one
    // may want to target a pre-configured plane. It is probably useless for
    // eglfs_kms and others. Do not confuse with generic plane support (available_planes).
    bool ok;
    int idx = qEnvironmentVariableIntValue("QT_QPA_EGLFS_KMS_PLANE_INDEX", &ok);
    if (ok) {
        drmModePlaneRes *planeResources = drmModeGetPlaneResources(m_dri_fd);
        if (planeResources) {
            if (idx >= 0 && idx < int(planeResources->count_planes)) {
                drmModePlane *plane = drmModeGetPlane(m_dri_fd, planeResources->planes[idx]);
                if (plane) {
                    output.wants_forced_plane = true;
                    output.forced_plane_id = plane->plane_id;
                    qCDebug(qLcKmsDebug, "Forcing plane index %d, plane id %u (belongs to crtc id %u)",
                            idx, plane->plane_id, plane->crtc_id);

                    for (QKmsPlane &kmsplane : m_planes) {
                        if (kmsplane.id == output.forced_plane_id) {
                            assignPlane(&output, &kmsplane);
                            break;
                        }
                    }

                    drmModeFreePlane(plane);
                }
            } else {
                qWarning("Invalid plane index %d, must be between 0 and %u", idx, planeResources->count_planes - 1);
            }
        }
    }

    // A more useful version: allows specifying "crtc_id,plane_id:crtc_id,plane_id:..."
    // in order to allow overriding the plane used for a given crtc.
    if (qEnvironmentVariableIsSet("QT_QPA_EGLFS_KMS_PLANES_FOR_CRTCS")) {
        const QString val = qEnvironmentVariable("QT_QPA_EGLFS_KMS_PLANES_FOR_CRTCS");
        qCDebug(qLcKmsDebug, "crtc_id:plane_id override list: %s", qPrintable(val));
        const QStringList crtcPlanePairs = val.split(u':');
        for (const QString &crtcPlanePair : crtcPlanePairs) {
            const QStringList values = crtcPlanePair.split(u',');
            if (values.size() == 2 && uint(values[0].toInt()) == output.crtc_id) {
                uint planeId = values[1].toInt();
                for (QKmsPlane &kmsplane : m_planes) {
                    if (kmsplane.id == planeId) {
                        assignPlane(&output, &kmsplane);
                        break;
                    }
                }
            }
        }
    }

    if (output.eglfs_plane) {
        qCDebug(qLcKmsDebug, "Chose plane %u for output %s (crtc id %u) (may not be applicable)",
                output.eglfs_plane->id, connectorName.constData(), output.crtc_id);
    }

#if QT_CONFIG(drm_atomic)
    if (hasAtomicSupport() && !output.eglfs_plane) {
        qCDebug(qLcKmsDebug, "No plane associated with output %s (crtc id %u) and atomic modesetting is enabled. This is bad.",
                connectorName.constData(), output.crtc_id);
    }
#endif

    m_crtc_allocator |= (1 << output.crtc_index);

    vinfo->output = output;

    return createScreen(output);
}